

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.cpp
# Opt level: O0

void ixy::write_io32(ostream *s,size_t offset,uint32_t value)

{
  size_t sVar1;
  ulong uVar2;
  undefined1 local_51;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_50;
  fpos local_40 [16];
  fpos<__mbstate_t> local_30;
  uint32_t local_1c;
  size_t sStack_18;
  uint32_t value_local;
  size_t offset_local;
  ostream *s_local;
  
  local_1c = value;
  sStack_18 = offset;
  offset_local = (size_t)s;
  std::fpos<__mbstate_t>::fpos(&local_30,offset);
  std::ostream::seekp(s,local_30._M_off,local_30._M_state);
  local_40 = (fpos  [16])std::ostream::tellp();
  sVar1 = std::fpos::operator_cast_to_long(local_40);
  if (sVar1 != sStack_18) {
    __assert_fail("(size_t) s.tellp() == offset",
                  "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/pci.cpp"
                  ,0x8e,"void ixy::write_io32(std::ostream &, size_t, uint32_t)");
  }
  std::ostream::write((char *)offset_local,(long)&local_1c);
  uVar2 = std::ios::operator!((ios *)(offset_local + *(long *)(*(long *)offset_local + -0x18)));
  if ((uVar2 & 1) != 0) {
    memset(&local_51,0,1);
    local_50.list.second = (char *)operator<<("failed to write IO resource");
    error<ixy::Pair<ixy::None,char_const*>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/pci.cpp",
               0x91,"write_io32",&local_50);
  }
  return;
}

Assistant:

void write_io32(std::ostream &s, size_t offset, uint32_t value) {
    s.seekp(offset);
    assert((size_t) s.tellp() == offset);
    s.write(reinterpret_cast<char *>(&value), sizeof(value));
    if (!s) {
        error("failed to write IO resource");
    }
}